

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::changeObjReal(SoPlexBase<double> *this,VectorBase<double> *obj)

{
  SPxLPRational *pSVar1;
  int iVar2;
  Statistics *in_RSI;
  SoPlexBase<double> *in_RDI;
  bool scale;
  SoPlexBase<double> *in_stack_ffffffffffffffb0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_11;
  Statistics *local_10;
  
  local_10 = in_RSI;
  local_11 = SPxLPBase<double>::isScaled(in_RDI->_realLP);
  (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x23])
            (in_RDI->_realLP,local_10,(ulong)(byte)local_11);
  iVar2 = intParam(in_RDI,SYNCMODE);
  if (iVar2 == 1) {
    pSVar1 = in_RDI->_rationalLP;
    in_stack_ffffffffffffffb0 = (SoPlexBase<double> *)&stack0xffffffffffffffd0;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase<double>(in_stack_ffffffffffffffc0,(VectorBase<double> *)in_RDI);
    (*(pSVar1->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x23])(pSVar1,in_stack_ffffffffffffffb0,0);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1d7ecc);
  }
  _invalidateSolution(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void SoPlexBase<R>::changeObjReal(const VectorBase<R>& obj)
{
   assert(_realLP != nullptr);

   bool scale = _realLP->isScaled();
   _realLP->changeObj(obj, scale);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
      _rationalLP->changeObj(VectorRational(obj));

   _invalidateSolution();
}